

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

int lj_trace_flushall(lua_State *L)

{
  uint64_t uVar1;
  GCtrace *T;
  TValue *pTVar2;
  long lVar3;
  ptrdiff_t argbase;
  GCstr *pGVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = (L->glref).ptr64;
  if ((*(byte *)(uVar1 + 0x91) & 0x40) == 0) {
    for (uVar6 = (ulong)*(uint *)(uVar1 + 0x46c); 1 < (long)uVar6; uVar6 = uVar6 - 1) {
      lVar3 = *(long *)(uVar1 + 0x460);
      T = *(GCtrace **)(lVar3 + -8 + uVar6 * 8);
      if (T != (GCtrace *)0x0) {
        if (T->root == 0) {
          trace_flushroot((jit_State *)(uVar1 + 0x2e0),T);
          lVar3 = *(long *)(uVar1 + 0x460);
        }
        T->traceno = 0;
        T->link = 0;
        *(undefined8 *)(lVar3 + -8 + uVar6 * 8) = 0;
      }
    }
    *(undefined2 *)(uVar1 + 0x348) = 0;
    *(undefined4 *)(uVar1 + 0x468) = 0;
    memset((void *)(uVar1 + 0xa00),0,0x400);
    lj_mcode_free((jit_State *)(uVar1 + 0x2e0));
    *(undefined8 *)(uVar1 + 0x9f0) = 0;
    *(undefined8 *)(uVar1 + 0x9f8) = 0;
    *(undefined8 *)(uVar1 + 0x9e0) = 0;
    *(undefined8 *)(uVar1 + 0x9e8) = 0;
    *(undefined8 *)(uVar1 + 0x9d0) = 0;
    *(undefined8 *)(uVar1 + 0x9d8) = 0;
    *(undefined8 *)(uVar1 + 0x9c0) = 0;
    *(undefined8 *)(uVar1 + 0x9c8) = 0;
    *(undefined8 *)(uVar1 + 0x9b0) = 0;
    *(undefined8 *)(uVar1 + 0x9b8) = 0;
    *(undefined8 *)(uVar1 + 0x9a0) = 0;
    *(undefined8 *)(uVar1 + 0x9a8) = 0;
    *(undefined8 *)(uVar1 + 0x990) = 0;
    *(undefined8 *)(uVar1 + 0x998) = 0;
    *(undefined8 *)(uVar1 + 0x980) = 0;
    *(undefined8 *)(uVar1 + 0x988) = 0;
    iVar5 = 0;
    if ((*(byte *)((L->glref).ptr64 + 0x93) & 2) != 0) {
      argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TRACE);
      if (argbase != 0) {
        pTVar2 = L->top;
        L->top = pTVar2 + 1;
        pGVar4 = lj_str_new(L,"flush",5);
        pTVar2->u64 = (ulong)pGVar4 | 0xfffd800000000000;
        lj_vmevent_call(L,argbase);
        iVar5 = 0;
      }
    }
  }
  else {
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int lj_trace_flushall(lua_State *L)
{
  jit_State *J = L2J(L);
  ptrdiff_t i;
  if ((J2G(J)->hookmask & HOOK_GC))
    return 1;
  for (i = (ptrdiff_t)J->sizetrace-1; i > 0; i--) {
    GCtrace *T = traceref(J, i);
    if (T) {
      if (T->root == 0)
	trace_flushroot(J, T);
      lj_gdbjit_deltrace(J, T);
      T->traceno = T->link = 0;  /* Blacklist the link for cont_stitch. */
      setgcrefnull(J->trace[i]);
    }
  }
  J->cur.traceno = 0;
  J->freetrace = 0;
  /* Clear penalty cache. */
  memset(J->penalty, 0, sizeof(J->penalty));
  /* Free the whole machine code and invalidate all exit stub groups. */
  lj_mcode_free(J);
  memset(J->exitstubgroup, 0, sizeof(J->exitstubgroup));
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "flush"));
  );
  return 0;
}